

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O3

void __thiscall Spectrum_SamplingPdfXYZ_Test::TestBody(Spectrum_SamplingPdfXYZ_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *piVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  char *message;
  undefined1 *puVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 extraout_var [60];
  float fVar14;
  float fVar15;
  undefined1 auVar16 [64];
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  undefined8 in_XMM3_Qb;
  AssertionResult gtest_ar;
  float local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  float local_8c;
  AssertHelper local_88;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
  iVar9 = 0;
  puVar10 = &DAT_5851f42d4c957f2e;
  local_68 = ZEXT816(0);
  do {
    piVar3 = pbrt::Spectra::x;
    local_58 = auVar16._0_16_;
    uVar6 = (uint)((ulong)puVar10 >> 0x2d) ^ (uint)((ulong)puVar10 >> 0x1b);
    bVar8 = (byte)((ulong)puVar10 >> 0x3b);
    auVar11._4_4_ = in_XMM3_Db;
    auVar11._0_4_ = in_XMM3_Da;
    auVar11._8_8_ = in_XMM3_Qb;
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar6 >> bVar8 | uVar6 << 0x20 - bVar8);
    auVar11 = vminss_avx(ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    fVar14 = (auVar11._0_4_ + (float)iVar9) / 10000.0;
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * 830.0)),ZEXT416((uint)(1.0 - fVar14)),
                              ZEXT416(0x43b40000));
    local_78._0_4_ = auVar11._0_4_;
    lVar7 = lroundf(auVar11._0_4_);
    piVar4 = pbrt::Spectra::y;
    uVar6 = (int)lVar7 - *piVar3;
    fVar12 = 0.0;
    if ((-1 < (int)uVar6) && ((ulong)uVar6 < *(ulong *)(piVar3 + 8))) {
      fVar12 = *(float *)(*(long *)(piVar3 + 4) + (ulong)uVar6 * 4);
    }
    lVar7 = lroundf((float)local_78._0_4_);
    piVar3 = pbrt::Spectra::z;
    uVar6 = (int)lVar7 - *piVar4;
    local_8c = 0.0;
    if ((-1 < (int)uVar6) && ((ulong)uVar6 < *(ulong *)(piVar4 + 8))) {
      local_8c = *(float *)(*(long *)(piVar4 + 4) + (ulong)uVar6 * 4);
    }
    lVar7 = lroundf((float)local_78._0_4_);
    uVar6 = (int)lVar7 - *piVar3;
    if ((int)uVar6 < 0) {
      fVar15 = 0.0;
    }
    else {
      fVar15 = 0.0;
      if ((ulong)uVar6 < *(ulong *)(piVar3 + 8)) {
        fVar15 = *(float *)(*(long *)(piVar3 + 4) + (ulong)uVar6 * 4);
      }
    }
    local_78._0_4_ = (fVar12 + local_8c + fVar15) / 0.0021276595;
    auVar11 = vfmadd132ss_fma(ZEXT416((uint)fVar14),SUB6416(ZEXT464(0x3f5b5e7f),0),
                              ZEXT416(0xbfe9eb96));
    auVar16._0_4_ = atanhf(auVar11._0_4_);
    auVar16._4_60_ = extraout_var;
    auVar11 = vfmadd132ss_fma(auVar16._0_16_,SUB6416(ZEXT464(0x44068000),0),ZEXT416(0xc30ae38e));
    fVar12 = auVar11._0_4_;
    if ((360.0 <= fVar12) && (fVar12 <= 830.0)) {
      fVar14 = coshf((fVar12 + -538.0) * 0.0072);
      piVar3 = pbrt::Spectra::x;
      fVar14 = 0.003939804 / (fVar14 * fVar14);
      if (0.0 < fVar14) {
        local_8c = fVar14;
        lVar7 = lroundf(fVar12);
        piVar4 = pbrt::Spectra::y;
        uVar6 = (int)lVar7 - *piVar3;
        local_7c = 0.0;
        local_a0 = 0.0;
        if ((-1 < (int)uVar6) && ((ulong)uVar6 < *(ulong *)(piVar3 + 8))) {
          local_7c = *(float *)(*(long *)(piVar3 + 4) + (ulong)uVar6 * 4);
        }
        lVar7 = lroundf(fVar12);
        piVar3 = pbrt::Spectra::z;
        uVar6 = (int)lVar7 - *piVar4;
        if ((-1 < (int)uVar6) && ((ulong)uVar6 < *(ulong *)(piVar4 + 8))) {
          local_a0 = *(float *)(*(long *)(piVar4 + 4) + (ulong)uVar6 * 4);
        }
        lVar7 = lroundf(fVar12);
        uVar6 = (int)lVar7 - *piVar3;
        fVar12 = 0.0;
        if ((-1 < (int)uVar6) && ((ulong)uVar6 < *(ulong *)(piVar3 + 8))) {
          fVar12 = *(float *)(*(long *)(piVar3 + 4) + (ulong)uVar6 * 4);
        }
        local_68 = ZEXT416((uint)((float)local_68._0_4_ + (local_7c + local_a0 + fVar12) / local_8c)
                          );
      }
    }
    iVar9 = iVar9 + 1;
    auVar16 = ZEXT464((uint)((float)local_58._0_4_ + (float)local_78._0_4_));
    puVar10 = (undefined1 *)((long)puVar10 * 0x5851f42d4c957f2d + 1);
  } while (iVar9 != 10000);
  local_98.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f50624dd2f1a9fc;
  auVar11 = vinsertps_avx(local_68,ZEXT416((uint)((float)local_58._0_4_ + (float)local_78._0_4_)),
                          0x10);
  auVar1._8_4_ = 0x461c4000;
  auVar1._0_8_ = 0x461c4000461c4000;
  auVar1._12_4_ = 0x461c4000;
  local_78 = vdivps_avx512vl(auVar11,auVar1);
  local_58 = vmovshdup_avx(local_78);
  auVar13._0_4_ = (local_78._0_4_ - local_58._0_4_) / local_58._0_4_;
  auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar13,auVar2);
  local_88.data_._0_4_ = auVar11._0_4_;
  testing::internal::CmpHelperLT<float,double>
            (local_40,"std::abs((impInt - unifInt) / unifInt)","1e-3",(float *)&local_88,
             (double *)&local_98);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    std::ostream::_M_insert<double>((double)(float)local_78._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_98.ptr_ + 0x10)," vs. ",5);
    std::ostream::_M_insert<double>((double)(float)local_58._0_4_);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum_test.cpp"
               ,0xa2,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Spectrum, SamplingPdfXYZ) {
    // Make sure we can integrate the sum of the x+y+z matching curves correctly
    Float impSum = 0, unifSum = 0;
    int n = 10000;
    for (Float u : Stratified1D(n)) {
        {
            // Uniform
            Float lambda = Lerp(u, Lambda_min, Lambda_max);
            Float pdf = 1. / (Lambda_max - Lambda_min);
            unifSum +=
                (Spectra::X()(lambda) + Spectra::Y()(lambda) + Spectra::Z()(lambda)) /
                pdf;
        }

        Float lambda = SampleXYZMatching(u);
        Float pdf = XYZMatchingPDF(lambda);
        if (pdf > 0)
            impSum +=
                (Spectra::X()(lambda) + Spectra::Y()(lambda) + Spectra::Z()(lambda)) /
                pdf;
    }
    Float impInt = impSum / n, unifInt = unifSum / n;

    EXPECT_LT(std::abs((impInt - unifInt) / unifInt), 1e-3)
        << impInt << " vs. " << unifInt;
}